

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O2

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Resolve(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *baseuri,CrtAllocator *allocator)

{
  SizeType SVar1;
  SizeType SVar2;
  uint uVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  ulong __n;
  size_t len;
  long lVar6;
  long lVar7;
  
  __return_storage_ptr__->frag_ = (Ch *)0x0;
  __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->path_ = (Ch *)0x0;
  __return_storage_ptr__->query_ = (Ch *)0x0;
  __return_storage_ptr__->scheme_ = (Ch *)0x0;
  __return_storage_ptr__->auth_ = (Ch *)0x0;
  __return_storage_ptr__->uri_ = (Ch *)0x0;
  __return_storage_ptr__->base_ = (Ch *)0x0;
  __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->allocator_ = allocator;
  SVar1 = GetStringLength(this);
  SVar2 = GetStringLength(baseuri);
  Allocate(__return_storage_ptr__,(ulong)(SVar1 + SVar2 + 1));
  SVar1 = GetSchemeStringLength(this);
  pCVar5 = __return_storage_ptr__->scheme_;
  if (SVar1 == 0) {
    pCVar4 = baseuri->scheme_;
    SVar1 = GetSchemeStringLength(baseuri);
    pCVar5 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
    __return_storage_ptr__->auth_ = pCVar5;
    SVar1 = GetAuthStringLength(this);
    pCVar5 = __return_storage_ptr__->auth_;
    if (SVar1 == 0) {
      pCVar4 = baseuri->auth_;
      SVar1 = GetAuthStringLength(baseuri);
      pCVar5 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
      __return_storage_ptr__->path_ = pCVar5;
      SVar1 = GetPathStringLength(this);
      if (SVar1 == 0) {
        pCVar5 = __return_storage_ptr__->path_;
        pCVar4 = baseuri->path_;
        SVar1 = GetPathStringLength(baseuri);
        pCVar5 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
        __return_storage_ptr__->query_ = pCVar5;
        SVar1 = GetQueryStringLength(this);
        pCVar5 = __return_storage_ptr__->query_;
        if (SVar1 == 0) {
          pCVar4 = baseuri->query_;
          SVar1 = GetQueryStringLength(baseuri);
          len = (size_t)SVar1;
        }
        else {
          pCVar4 = this->query_;
          SVar1 = GetQueryStringLength(this);
          len = (size_t)SVar1;
        }
      }
      else {
        pCVar5 = this->path_;
        if (*pCVar5 == '/') {
          pCVar4 = __return_storage_ptr__->path_;
          SVar1 = GetPathStringLength(this);
          pCVar5 = CopyPart(this,pCVar4,pCVar5,(ulong)SVar1);
          __return_storage_ptr__->query_ = pCVar5;
          RemoveDotSegments(__return_storage_ptr__);
        }
        else {
          SVar1 = GetAuthStringLength(baseuri);
          if (SVar1 == 0) {
LAB_001418ba:
            lVar6 = 0;
          }
          else {
            SVar1 = GetPathStringLength(baseuri);
            if (SVar1 != 0) goto LAB_001418ba;
            *__return_storage_ptr__->path_ = '/';
            lVar6 = 1;
          }
          SVar1 = GetPathStringLength(baseuri);
          lVar7 = -(lVar6 + (ulong)SVar1);
          __n = (ulong)SVar1;
          while ((__n != 0 && (baseuri->path_[__n - 1] != '/'))) {
            lVar7 = lVar7 + 1;
            __n = __n - 1;
          }
          memcpy(__return_storage_ptr__->path_ + lVar6,baseuri->path_,__n);
          pCVar5 = __return_storage_ptr__->path_;
          pCVar4 = this->path_;
          SVar1 = GetPathStringLength(this);
          pCVar5 = CopyPart(this,pCVar5 + -lVar7,pCVar4,(ulong)SVar1);
          __return_storage_ptr__->query_ = pCVar5;
          RemoveDotSegments(__return_storage_ptr__);
        }
        pCVar5 = __return_storage_ptr__->query_;
        pCVar4 = this->query_;
        SVar1 = GetQueryStringLength(this);
        len = (size_t)SVar1;
      }
      pCVar5 = CopyPart(this,pCVar5,pCVar4,len);
      __return_storage_ptr__->frag_ = pCVar5;
      goto LAB_00141796;
    }
    pCVar4 = this->auth_;
    SVar1 = GetAuthStringLength(this);
    pCVar4 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
    __return_storage_ptr__->path_ = pCVar4;
    pCVar5 = this->path_;
    SVar1 = GetPathStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar5,(ulong)SVar1);
    __return_storage_ptr__->query_ = pCVar4;
    pCVar5 = this->query_;
    uVar3 = GetQueryStringLength(this);
  }
  else {
    pCVar4 = this->scheme_;
    SVar1 = GetSchemeStringLength(this);
    pCVar4 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
    __return_storage_ptr__->auth_ = pCVar4;
    pCVar5 = this->auth_;
    SVar1 = GetAuthStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar5,(ulong)SVar1);
    __return_storage_ptr__->path_ = pCVar4;
    pCVar5 = this->path_;
    SVar1 = GetPathStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar5,(ulong)SVar1);
    __return_storage_ptr__->query_ = pCVar4;
    pCVar5 = this->query_;
    uVar3 = GetQueryStringLength(this);
  }
  pCVar5 = CopyPart(this,pCVar4,pCVar5,(ulong)uVar3);
  __return_storage_ptr__->frag_ = pCVar5;
  RemoveDotSegments(__return_storage_ptr__);
LAB_00141796:
  pCVar5 = __return_storage_ptr__->frag_;
  pCVar4 = this->frag_;
  SVar1 = GetFragStringLength(this);
  pCVar5 = CopyPart(this,pCVar5,pCVar4,(ulong)SVar1);
  __return_storage_ptr__->base_ = pCVar5;
  SetBase(__return_storage_ptr__);
  pCVar5 = __return_storage_ptr__->base_;
  SVar1 = GetBaseStringLength(__return_storage_ptr__);
  __return_storage_ptr__->uri_ = pCVar5 + (ulong)SVar1 + 1;
  SetUri(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GenericUri Resolve(const GenericUri& baseuri, Allocator* allocator = 0) {
        GenericUri resuri;
        resuri.allocator_ = allocator;
        // Ensure enough space for combining paths
        resuri.Allocate(GetStringLength() + baseuri.GetStringLength() + 1); // + 1 for joining slash

        if (!(GetSchemeStringLength() == 0)) {
            // Use all of this URI
            resuri.auth_ = CopyPart(resuri.scheme_, scheme_, GetSchemeStringLength());
            resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
            resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
            resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
            resuri.RemoveDotSegments();
        } else {
            // Use the base scheme
            resuri.auth_ = CopyPart(resuri.scheme_, baseuri.scheme_, baseuri.GetSchemeStringLength());
            if (!(GetAuthStringLength() == 0)) {
                // Use this auth, path, query
                resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
                resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                resuri.RemoveDotSegments();
            } else {
                // Use the base auth
                resuri.path_ = CopyPart(resuri.auth_, baseuri.auth_, baseuri.GetAuthStringLength());
                if (GetPathStringLength() == 0) {
                    // Use the base path
                    resuri.query_ = CopyPart(resuri.path_, baseuri.path_, baseuri.GetPathStringLength());
                    if (GetQueryStringLength() == 0) {
                        // Use the base query
                        resuri.frag_ = CopyPart(resuri.query_, baseuri.query_, baseuri.GetQueryStringLength());
                    } else {
                        // Use this query
                        resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                    }
                } else {
                    if (path_[0] == '/') {
                        // Absolute path - use all of this path
                        resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    } else {
                        // Relative path - append this path to base path after base path's last slash
                        size_t pos = 0;
                        if (!(baseuri.GetAuthStringLength() == 0) && baseuri.GetPathStringLength() == 0) {
                            resuri.path_[pos] = '/';
                            pos++;
                        }
                        size_t lastslashpos = baseuri.GetPathStringLength();
                        while (lastslashpos > 0) {
                            if (baseuri.path_[lastslashpos - 1] == '/') break;
                            lastslashpos--;
                        }
                        std::memcpy(&resuri.path_[pos], baseuri.path_, lastslashpos * sizeof(Ch));
                        pos += lastslashpos;
                        resuri.query_ = CopyPart(&resuri.path_[pos], path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    }
                    // Use this query
                    resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                }
            }
        }
        // Always use this frag
        resuri.base_ = CopyPart(resuri.frag_, frag_, GetFragStringLength());

        // Re-constitute base_ and uri_
        resuri.SetBase();
        resuri.uri_ = resuri.base_ + resuri.GetBaseStringLength() + 1;
        resuri.SetUri();
        return resuri;
    }